

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

SoapySDRArgInfo *
SoapySDRDevice_getSettingInfoWithKey
          (SoapySDRArgInfo *__return_storage_ptr__,SoapySDRDevice *device,char *key)

{
  undefined1 *puVar1;
  allocator local_139;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  ArgInfo local_118;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_138,key,&local_139);
  (**(code **)(*(long *)device + 0x328))(&local_118,device,local_138);
  toArgInfo(__return_storage_ptr__,&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.optionNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.units._M_dataplus._M_p != &local_118.units.field_2) {
    operator_delete(local_118.units._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.description._M_dataplus._M_p != &local_118.description.field_2) {
    operator_delete(local_118.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.name._M_dataplus._M_p != &local_118.name.field_2) {
    operator_delete(local_118.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.value._M_dataplus._M_p != &local_118.value.field_2) {
    operator_delete(local_118.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.key._M_dataplus._M_p != &local_118.key.field_2) {
    operator_delete(local_118.key._M_dataplus._M_p);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getSettingInfoWithKey(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSettingInfo(key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfo())
}